

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O2

bool common_params_parse(int argc,char **argv,common_params *params,llama_example ex,
                        _func_void_int_char_ptr_ptr *print_usage)

{
  cpu_params *cpuparams;
  llama_example *plVar1;
  pointer ppcVar2;
  _func_void_common_params_ptr_int *p_Var3;
  string *psVar4;
  common_params *pcVar5;
  pointer pcVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  mapped_type *ppcVar10;
  iterator iVar11;
  invalid_argument *piVar12;
  runtime_error *this;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *antiprompt;
  string *psVar14;
  char **arg_1;
  pointer ppcVar15;
  long lVar16;
  string *psVar17;
  common_arg *opt;
  pointer pcVar18;
  pointer pcVar19;
  allocator<char> local_16dd;
  int local_16dc;
  char **local_16d8;
  int local_16cc;
  anon_class_8_1_89897dcb check_arg;
  common_params_context ctx_arg;
  string val2;
  string arg_2;
  string arg_prefix_1;
  string local_15b8 [32];
  string local_1598 [32];
  string local_1578 [40];
  string val;
  string value;
  char *local_1440;
  _func_void_common_params_ptr *local_1410;
  _func_void_common_params_ptr_string_ptr *local_1408;
  _func_void_common_params_ptr_string_ptr_string_ptr *local_1400;
  _func_void_common_params_ptr_int *local_13f8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
  arg_to_options;
  string arg_prefix;
  string arg;
  common_params params_org;
  
  local_16d8 = argv;
  common_params_parser_init(&ctx_arg,params,ex,print_usage);
  common_params::common_params(&params_org,ctx_arg.params);
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  local_16dc = argc;
  local_16cc = argc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg_prefix,"--",(allocator<char> *)&value);
  pcVar19 = ctx_arg.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pcVar5 = ctx_arg.params;
  arg_to_options._M_h._M_buckets = &arg_to_options._M_h._M_single_bucket;
  arg_to_options._M_h._M_bucket_count = 1;
  arg_to_options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  arg_to_options._M_h._M_element_count = 0;
  arg_to_options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  arg_to_options._M_h._M_rehash_policy._M_next_resize = 0;
  arg_to_options._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (pcVar18 = ctx_arg.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl
                 .super__Vector_impl_data._M_start;
      pcVar6 = ctx_arg.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
               super__Vector_impl_data._M_finish, pcVar18 != pcVar19; pcVar18 = pcVar18 + 1) {
    ppcVar2 = (pcVar18->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar15 = (pcVar18->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppcVar15 != ppcVar2;
        ppcVar15 = ppcVar15 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&value,*ppcVar15,(allocator<char> *)&arg_prefix_1);
      ppcVar10 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&arg_to_options,&value);
      *ppcVar10 = pcVar18;
      std::__cxx11::string::~string((string *)&value);
    }
  }
  for (pcVar19 = ctx_arg.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl
                 .super__Vector_impl_data._M_start; pcVar19 != pcVar6; pcVar19 = pcVar19 + 1) {
    value._M_string_length = 0;
    value.field_2._M_allocated_capacity = value.field_2._M_allocated_capacity & 0xffffffffffffff00;
    value._M_dataplus._M_p = (pointer)&value.field_2;
    bVar7 = common_arg::get_value_from_env(pcVar19,&value);
    if (bVar7) {
      if (pcVar19->handler_void != (_func_void_common_params_ptr *)0x0) {
        bVar7 = std::operator==(&value,"1");
        if (!bVar7) {
          bVar7 = std::operator==(&value,"true");
          if (!bVar7) goto LAB_00132c70;
        }
        (*pcVar19->handler_void)(pcVar5);
      }
LAB_00132c70:
      p_Var3 = pcVar19->handler_int;
      if (p_Var3 != (_func_void_common_params_ptr_int *)0x0) {
        iVar8 = std::__cxx11::stoi(&value,(size_t *)0x0,10);
        (*p_Var3)(pcVar5,iVar8);
      }
      if (pcVar19->handler_string != (_func_void_common_params_ptr_string_ptr *)0x0) {
        (*pcVar19->handler_string)(pcVar5,&value);
      }
    }
    std::__cxx11::string::~string((string *)&value);
  }
  check_arg.argc = &local_16dc;
  iVar8 = 1;
  while( true ) {
    if (local_16dc <= iVar8) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg_prefix_1,"--",(allocator<char> *)&value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg_2,local_16d8[iVar8],(allocator<char> *)&value);
    iVar9 = std::__cxx11::string::compare((ulong)&arg_2,0,(string *)arg_prefix_1._M_string_length);
    if (iVar9 == 0) {
      value._M_dataplus._M_p._0_1_ = 0x5f;
      val._M_dataplus._M_p._0_1_ = 0x2d;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )arg_2._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(arg_2._M_dataplus._M_p + arg_2._M_string_length),(char *)&value,(char *)&val);
    }
    iVar11 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&arg_to_options._M_h,&arg_2);
    if (iVar11.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_true>
        ._M_cur == (__node_type *)0x0) {
      piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
      string_format_abi_cxx11_(&value,"error: invalid argument: %s",arg_2._M_dataplus._M_p);
      std::invalid_argument::invalid_argument(piVar12,(string *)&value);
      __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    ppcVar10 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&arg_to_options,&arg_2);
    common_arg::common_arg((common_arg *)&value,*ppcVar10);
    bVar7 = common_arg::has_value_from_env((common_arg *)&value);
    if (bVar7) {
      fprintf(_stderr,
              "warn: %s environment variable is set, but will be overwritten by command line argument %s\n"
              ,local_1440,arg_2._M_dataplus._M_p);
    }
    if (local_1410 == (_func_void_common_params_ptr *)0x0) {
      common_params_parse_ex::anon_class_8_1_89897dcb::operator()(&check_arg,iVar8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&val,local_16d8[(long)iVar8 + 1],(allocator<char> *)&val2);
      iVar9 = iVar8 + 1;
      if (local_13f8 == (_func_void_common_params_ptr_int *)0x0) {
        if (local_1408 == (_func_void_common_params_ptr_string_ptr *)0x0) {
          common_params_parse_ex::anon_class_8_1_89897dcb::operator()(&check_arg,iVar9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&val2,local_16d8[(long)iVar8 + 2],&local_16dd);
          if (local_1400 != (_func_void_common_params_ptr_string_ptr_string_ptr *)0x0) {
            (*local_1400)(pcVar5,&val,&val2);
          }
          iVar9 = iVar8 + 2;
          std::__cxx11::string::~string((string *)&val2);
        }
        else {
          (*local_1408)(pcVar5,&val);
        }
      }
      else {
        iVar8 = std::__cxx11::stoi(&val,(size_t *)0x0,10);
        (*local_13f8)(pcVar5,iVar8);
      }
      std::__cxx11::string::~string((string *)&val);
    }
    else {
      (*local_1410)(pcVar5);
      iVar9 = iVar8;
    }
    common_arg::~common_arg((common_arg *)&value);
    std::__cxx11::string::~string((string *)&arg_2);
    std::__cxx11::string::~string((string *)&arg_prefix_1);
    iVar8 = iVar9 + 1;
  }
  cpuparams = &pcVar5->cpuparams;
  postprocess_cpu_params(cpuparams,(cpu_params *)0x0);
  postprocess_cpu_params(&pcVar5->cpuparams_batch,cpuparams);
  postprocess_cpu_params(&(pcVar5->speculative).cpuparams,cpuparams);
  postprocess_cpu_params(&(pcVar5->speculative).cpuparams_batch,&pcVar5->cpuparams_batch);
  if ((pcVar5->prompt_cache_all == true) &&
     ((pcVar5->interactive != false || (pcVar5->interactive_first == true)))) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar12,"error: --prompt-cache-all not supported in interactive mode yet\n");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg_prefix_1,"models/7B/ggml-model-f16.gguf",(allocator<char> *)&arg_2);
    psVar14 = &pcVar5->hf_token;
    common_params_handle_model((handle_model_result *)&value,&pcVar5->model,psVar14,&arg_prefix_1);
    std::__cxx11::string::~string((string *)&arg_prefix_1);
    if (pcVar5->no_mmproj == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arg_prefix_1,"",(allocator<char> *)&arg_2);
      std::__cxx11::string::string<std::allocator<char>>(local_15b8,"",(allocator<char> *)&arg_2);
      std::__cxx11::string::string<std::allocator<char>>(local_1598,"",(allocator<char> *)&arg_2);
      std::__cxx11::string::string<std::allocator<char>>(local_1578,"",(allocator<char> *)&arg_2);
      common_params_model::operator=(&pcVar5->mmproj,(common_params_model *)&arg_prefix_1);
      common_params_model::~common_params_model((common_params_model *)&arg_prefix_1);
    }
    else if ((((char)value._M_dataplus._M_p == '\x01') &&
             ((pcVar5->mmproj).path._M_string_length == 0)) &&
            ((pcVar5->mmproj).url._M_string_length == 0)) {
      common_params_model::operator=(&pcVar5->mmproj,(common_params_model *)&value._M_string_length)
      ;
    }
    lVar16 = 0;
    do {
      if (mmproj_examples._M_len << 2 == lVar16) goto LAB_00133118;
      plVar1 = (llama_example *)((long)mmproj_examples._M_array + lVar16);
      lVar16 = lVar16 + 4;
    } while (ctx_arg.ex != *plVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&arg_2,"",(allocator<char> *)&val);
    common_params_handle_model((handle_model_result *)&arg_prefix_1,&pcVar5->mmproj,psVar14,&arg_2);
    common_params_model::~common_params_model((common_params_model *)&arg_prefix_1._M_string_length)
    ;
    std::__cxx11::string::~string((string *)&arg_2);
LAB_00133118:
    std::__cxx11::string::string<std::allocator<char>>((string *)&val,"",(allocator<char> *)&val2);
    common_params_handle_model
              ((handle_model_result *)&arg_2,&(pcVar5->speculative).model,psVar14,&val);
    common_params_model::~common_params_model((common_params_model *)&arg_2._M_string_length);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::string<std::allocator<char>>((string *)&val2,"",&local_16dd);
    psVar17 = (string *)&pcVar5->vocoder;
    common_params_handle_model
              ((handle_model_result *)&val,(common_params_model *)psVar17,psVar14,&val2);
    common_params_model::~common_params_model((common_params_model *)&val._M_string_length);
    std::__cxx11::string::~string((string *)&val2);
    common_params_model::~common_params_model((common_params_model *)&value._M_string_length);
    if (pcVar5->escape == true) {
      string_process_escapes(&pcVar5->prompt);
      string_process_escapes(&pcVar5->input_prefix);
      string_process_escapes(&pcVar5->input_suffix);
      psVar4 = (pcVar5->antiprompt).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar14 = (pcVar5->antiprompt).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar4;
          psVar14 = psVar14 + 1) {
        string_process_escapes(psVar14);
      }
      psVar4 = (pcVar5->sampling).dry_sequence_breakers.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar14 = (pcVar5->sampling).dry_sequence_breakers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar4;
          psVar14 = psVar14 + 1) {
        string_process_escapes(psVar14);
      }
    }
    if ((pcVar5->kv_overrides).
        super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pcVar5->kv_overrides).
        super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::emplace_back<>
                (&pcVar5->kv_overrides);
      (pcVar5->kv_overrides).
      super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].key[0] = '\0';
    }
    if ((pcVar5->tensor_buft_overrides).
        super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pcVar5->tensor_buft_overrides).
        super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar17 = &value;
      value._M_dataplus._M_p = (pointer)0x0;
      value._M_string_length = 0;
      std::
      vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>::
      emplace_back<llama_model_tensor_buft_override>
                (&pcVar5->tensor_buft_overrides,(llama_model_tensor_buft_override *)psVar17);
    }
    if ((pcVar5->reranking != true) || (pcVar5->embedding != true)) {
      if ((pcVar5->chat_template)._M_string_length != 0) {
        psVar17 = (string *)(ulong)pcVar5->use_jinja;
        bVar7 = common_chat_verify_template(&pcVar5->chat_template,pcVar5->use_jinja);
        if (!bVar7) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          pcVar13 = 
          "\nnote: llama.cpp was started without --jinja, we only support commonly used templates";
          if (pcVar5->use_jinja != false) {
            pcVar13 = "";
          }
          string_format_abi_cxx11_
                    (&value,"error: the supplied chat template is not supported: %s%s\n",
                     (pcVar5->chat_template)._M_dataplus._M_p,pcVar13);
          std::runtime_error::runtime_error(this,(string *)&value);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&arg_to_options._M_h);
      std::__cxx11::string::~string((string *)&arg_prefix);
      std::__cxx11::string::~string((string *)&arg);
      if ((ctx_arg.params)->usage == true) {
        value._M_dataplus._M_p = (pointer)0x0;
        value._M_string_length = 0;
        value.field_2._M_allocated_capacity = 0;
        arg_prefix_1._M_dataplus._M_p = (pointer)0x0;
        arg_prefix_1._M_string_length = 0;
        arg_prefix_1.field_2._M_allocated_capacity = 0;
        arg_2.field_2._M_allocated_capacity = 0;
        arg_2._M_dataplus._M_p = (pointer)0x0;
        arg_2._M_string_length = 0;
        for (pcVar19 = ctx_arg.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pcVar19 !=
            ctx_arg.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
            super__Vector_impl_data._M_finish; pcVar19 = pcVar19 + 1) {
          psVar17 = &val;
          if (pcVar19->is_sparam == true) {
            val._M_dataplus._M_p = (pointer)pcVar19;
            std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                      ((vector<common_arg*,std::allocator<common_arg*>> *)&arg_prefix_1,
                       (common_arg **)&val);
          }
          else {
            bVar7 = common_arg::in_example(pcVar19,ctx_arg.ex);
            if (bVar7) {
              val._M_dataplus._M_p = (pointer)pcVar19;
              std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                        ((vector<common_arg*,std::allocator<common_arg*>> *)&arg_2,
                         (common_arg **)&val);
            }
            else {
              val._M_dataplus._M_p = (pointer)pcVar19;
              std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                        ((vector<common_arg*,std::allocator<common_arg*>> *)&value,
                         (common_arg **)&val);
            }
          }
        }
        puts("----- common params -----\n");
        common_params_print_usage::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&value,
                   (vector<common_arg_*,_std::allocator<common_arg_*>_> *)psVar17);
        puts("\n\n----- sampling params -----\n");
        common_params_print_usage::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&arg_prefix_1,
                   (vector<common_arg_*,_std::allocator<common_arg_*>_> *)psVar17);
        puts("\n\n----- example-specific params -----\n");
        common_params_print_usage::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&arg_2,
                   (vector<common_arg_*,_std::allocator<common_arg_*>_> *)psVar17);
        std::_Vector_base<common_arg_*,_std::allocator<common_arg_*>_>::~_Vector_base
                  ((_Vector_base<common_arg_*,_std::allocator<common_arg_*>_> *)&arg_2);
        std::_Vector_base<common_arg_*,_std::allocator<common_arg_*>_>::~_Vector_base
                  ((_Vector_base<common_arg_*,_std::allocator<common_arg_*>_> *)&arg_prefix_1);
        std::_Vector_base<common_arg_*,_std::allocator<common_arg_*>_>::~_Vector_base
                  ((_Vector_base<common_arg_*,_std::allocator<common_arg_*>_> *)&value);
        if (ctx_arg.print_usage != (_func_void_int_char_ptr_ptr *)0x0) {
          (*ctx_arg.print_usage)(local_16cc,local_16d8);
        }
      }
      else {
        if ((ctx_arg.params)->completion != true) {
          common_params::~common_params(&params_org);
          std::vector<common_arg,_std::allocator<common_arg>_>::~vector(&ctx_arg.options);
          return true;
        }
        common_params_print_completion(&ctx_arg);
      }
      exit(0);
    }
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar12,"error: either --embedding or --reranking can be specified, but not both");
  }
  __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool common_params_parse(int argc, char ** argv, common_params & params, llama_example ex, void(*print_usage)(int, char **)) {
    auto ctx_arg = common_params_parser_init(params, ex, print_usage);
    const common_params params_org = ctx_arg.params; // the example can modify the default params

    try {
        if (!common_params_parse_ex(argc, argv, ctx_arg)) {
            ctx_arg.params = params_org;
            return false;
        }
        if (ctx_arg.params.usage) {
            common_params_print_usage(ctx_arg);
            if (ctx_arg.print_usage) {
                ctx_arg.print_usage(argc, argv);
            }
            exit(0);
        }
        if (ctx_arg.params.completion) {
            common_params_print_completion(ctx_arg);
            exit(0);
        }
    } catch (const std::invalid_argument & ex) {
        fprintf(stderr, "%s\n", ex.what());
        ctx_arg.params = params_org;
        return false;
    }

    return true;
}